

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__is_16_main(stbi__context *s)

{
  int iVar1;
  stbi__png p;
  stbi__png local_28;
  
  local_28.s = s;
  iVar1 = stbi__parse_png_file(&local_28,2,0);
  if ((iVar1 == 0) || (iVar1 = 1, local_28.depth != 0x10)) {
    (local_28.s)->img_buffer = (local_28.s)->img_buffer_original;
    (local_28.s)->img_buffer_end = (local_28.s)->img_buffer_original_end;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int stbi__is_16_main(stbi__context *s)
{
   #ifndef STBI_NO_PNG
   if (stbi__png_is16(s))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_is16(s))  return 1;
   #endif

   #ifndef STBI_NO_PNM
   if (stbi__pnm_is16(s))  return 1;
   #endif
   return 0;
}